

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

int caption_frame_write_char
              (caption_frame_t *frame,int row,int col,eia608_style_t style,int underline,char *c)

{
  uint16_t uVar1;
  caption_frame_cell_t *dst;
  size_t sVar2;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  utf8_char_t *in_R9;
  caption_frame_cell_t *cell;
  utf8_char_t *in_stack_ffffffffffffffc8;
  
  if ((*(long *)(in_RDI + 0x1e40) == 0) || (uVar1 = _eia608_from_utf8(in_R9), uVar1 == 0)) {
    return 0;
  }
  dst = frame_buffer_cell(*(caption_frame_buffer_t **)(in_RDI + 0x1e40),in_ESI,in_EDX);
  if ((dst != (caption_frame_cell_t *)0x0) &&
     (sVar2 = utf8_char_copy((utf8_char_t *)dst,in_stack_ffffffffffffffc8), sVar2 != 0)) {
    *(byte *)dst = *(byte *)dst & 0xfe | in_R8B & 1;
    *(byte *)dst = *(byte *)dst & 0xf1 | (in_CL & 7) << 1;
    return 1;
  }
  return 0;
}

Assistant:

int caption_frame_write_char(caption_frame_t* frame, int row, int col, eia608_style_t style, int underline, const char* c)
{
    if (!frame->write || !_eia608_from_utf8(c)) {
        return 0;
    }

    caption_frame_cell_t* cell = frame_buffer_cell(frame->write, row, col);

    if (cell && utf8_char_copy(&cell->data[0], c)) {
        cell->uln = underline;
        cell->sty = style;
        return 1;
    }

    return 0;
}